

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

int Abc_AigCleanup(Abc_Aig_t *pMan)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = pMan->nEntries;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr + 2) = pvVar4;
  if (0 < pMan->nBins) {
    lVar8 = 0;
    do {
      for (pAVar6 = pMan->pBins[lVar8]; pAVar6 != (Abc_Obj_t *)0x0; pAVar6 = pAVar6->pNext) {
        if ((pAVar6->vFanouts).nSize == 0) {
          uVar2 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar2 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar5 = 0x10;
            }
            else {
              uVar5 = uVar3 * 2;
              if ((int)uVar5 <= (int)uVar3) goto LAB_001bc2a6;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = uVar5;
          }
LAB_001bc2a6:
          __ptr[1] = uVar2 + 1;
          *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pAVar6;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pMan->nBins);
  }
  uVar2 = __ptr[1];
  if (0 < (long)(int)uVar2) {
    lVar8 = *(long *)(__ptr + 2);
    lVar7 = 0;
    do {
      Abc_AigDeleteNode(pMan,*(Abc_Obj_t **)(lVar8 + lVar7 * 8));
      lVar7 = lVar7 + 1;
    } while ((int)uVar2 != lVar7);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return iVar1 - pMan->nEntries;
}

Assistant:

int Abc_AigCleanup( Abc_Aig_t * pMan )
{
    Vec_Ptr_t * vDangles;
    Abc_Obj_t * pAnd;
    int i, nNodesOld;
//    printf( "Strash0 = %d.  Strash1 = %d.  Strash100 = %d.  StrashM = %d.\n", 
//        pMan->nStrash0, pMan->nStrash1, pMan->nStrash5, pMan->nStrash2 );
    nNodesOld = pMan->nEntries;
    // collect the AND nodes that do not fanout
    vDangles = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            if ( Abc_ObjFanoutNum(pAnd) == 0 )
                Vec_PtrPush( vDangles, pAnd );
    // process the dangling nodes and their MFFCs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDangles, pAnd, i )
        Abc_AigDeleteNode( pMan, pAnd );
    Vec_PtrFree( vDangles );
    return nNodesOld - pMan->nEntries;
}